

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

LetDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::LetDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::AssertionItemPortListSyntax*&,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,AssertionItemPortListSyntax **args_3,Token *args_4,
          ExpressionSyntax *args_5,Token *args_6)

{
  Info *pIVar1;
  Info *pIVar2;
  AssertionItemPortListSyntax *pAVar3;
  size_type sVar4;
  pointer ppAVar5;
  Info *pIVar6;
  Info *pIVar7;
  SyntaxKind SVar8;
  undefined4 uVar9;
  TokenKind TVar10;
  undefined1 uVar11;
  NumericTokenFlags NVar12;
  uint32_t uVar13;
  TokenKind TVar14;
  undefined1 uVar15;
  NumericTokenFlags NVar16;
  uint32_t uVar17;
  TokenKind TVar18;
  undefined1 uVar19;
  NumericTokenFlags NVar20;
  uint32_t uVar21;
  TokenKind TVar22;
  undefined1 uVar23;
  NumericTokenFlags NVar24;
  uint32_t uVar25;
  LetDeclarationSyntax *pLVar26;
  long lVar27;
  
  pLVar26 = (LetDeclarationSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((LetDeclarationSyntax *)this->endPtr < pLVar26 + 1) {
    pLVar26 = (LetDeclarationSyntax *)allocateSlow(this,0x90,8);
  }
  else {
    this->head->current = (byte *)(pLVar26 + 1);
  }
  TVar10 = args_1->kind;
  uVar11 = args_1->field_0x2;
  NVar12.raw = (args_1->numFlags).raw;
  uVar13 = args_1->rawLen;
  pIVar1 = args_1->info;
  TVar14 = args_2->kind;
  uVar15 = args_2->field_0x2;
  NVar16.raw = (args_2->numFlags).raw;
  uVar17 = args_2->rawLen;
  pIVar2 = args_2->info;
  pAVar3 = *args_3;
  TVar18 = args_4->kind;
  uVar19 = args_4->field_0x2;
  NVar20.raw = (args_4->numFlags).raw;
  uVar21 = args_4->rawLen;
  pIVar6 = args_4->info;
  TVar22 = args_6->kind;
  uVar23 = args_6->field_0x2;
  NVar24.raw = (args_6->numFlags).raw;
  uVar25 = args_6->rawLen;
  pIVar7 = args_6->info;
  (pLVar26->super_MemberSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pLVar26->super_MemberSyntax).super_SyntaxNode.kind = LetDeclaration;
  SVar8 = (args->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar9 = *(undefined4 *)&(args->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (pLVar26->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (args->super_SyntaxListBase).super_SyntaxNode.parent;
  (pLVar26->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind = SVar8;
  *(undefined4 *)
   &(pLVar26->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar9
  ;
  (pLVar26->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00507f08;
  (pLVar26->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_SyntaxListBase).childCount;
  sVar4 = (args->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).size_
  ;
  (pLVar26->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
       (args->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).data_;
  (pLVar26->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ = sVar4;
  (pLVar26->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_00508348;
  (pLVar26->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (SyntaxNode *)pLVar26;
  sVar4 = (pLVar26->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_;
  if (sVar4 != 0) {
    ppAVar5 = (pLVar26->super_MemberSyntax).attributes.
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_;
    lVar27 = 0;
    do {
      **(undefined8 **)((long)ppAVar5 + lVar27) = pLVar26;
      lVar27 = lVar27 + 8;
    } while (sVar4 << 3 != lVar27);
  }
  (pLVar26->let).kind = TVar10;
  (pLVar26->let).field_0x2 = uVar11;
  (pLVar26->let).numFlags = (NumericTokenFlags)NVar12.raw;
  (pLVar26->let).rawLen = uVar13;
  (pLVar26->let).info = pIVar1;
  (pLVar26->identifier).kind = TVar14;
  (pLVar26->identifier).field_0x2 = uVar15;
  (pLVar26->identifier).numFlags = (NumericTokenFlags)NVar16.raw;
  (pLVar26->identifier).rawLen = uVar17;
  (pLVar26->identifier).info = pIVar2;
  pLVar26->portList = pAVar3;
  (pLVar26->equals).kind = TVar18;
  (pLVar26->equals).field_0x2 = uVar19;
  (pLVar26->equals).numFlags = (NumericTokenFlags)NVar20.raw;
  (pLVar26->equals).rawLen = uVar21;
  (pLVar26->equals).info = pIVar6;
  (pLVar26->expr).ptr = args_5;
  (pLVar26->semi).kind = TVar22;
  (pLVar26->semi).field_0x2 = uVar23;
  (pLVar26->semi).numFlags = (NumericTokenFlags)NVar24.raw;
  (pLVar26->semi).rawLen = uVar25;
  (pLVar26->semi).info = pIVar7;
  if (pAVar3 != (AssertionItemPortListSyntax *)0x0) {
    (pAVar3->super_SyntaxNode).parent = (SyntaxNode *)pLVar26;
  }
  (args_5->super_SyntaxNode).parent = (SyntaxNode *)pLVar26;
  return pLVar26;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }